

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O2

string * __thiscall
tinyusdz::print_payload_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,PayloadList *payload,uint32_t indent)

{
  uint uVar1;
  ostream *poVar2;
  uint32_t n;
  ListEditQual v;
  type vars;
  stringstream ss;
  vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_> local_1e8;
  string local_1d0;
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  
  ::std::__cxx11::stringstream::stringstream(local_1b0);
  uVar1 = *(uint *)this;
  std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>::vector
            (&local_1e8,(vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_> *)(this + 8))
  ;
  pprint::Indent_abi_cxx11_(&local_1d0,(pprint *)((ulong)payload & 0xffffffff),n);
  ::std::operator<<(local_1a0,(string *)&local_1d0);
  ::std::__cxx11::string::_M_dispose();
  if (uVar1 != 0) {
    to_string_abi_cxx11_(&local_1d0,(tinyusdz *)(ulong)uVar1,v);
    poVar2 = ::std::operator<<(local_1a0,(string *)&local_1d0);
    ::std::operator<<(poVar2," ");
    ::std::__cxx11::string::_M_dispose();
  }
  ::std::operator<<(local_1a0,"payload = ");
  if (local_1e8.super__Vector_base<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_1e8.super__Vector_base<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    ::std::operator<<(local_1a0,"None");
  }
  else if ((long)local_1e8.super__Vector_base<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)local_1e8.super__Vector_base<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>
                 ._M_impl.super__Vector_impl_data._M_start == 0x120) {
    ::std::operator<<(local_1a0,
                      local_1e8.
                      super__Vector_base<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>.
                      _M_impl.super__Vector_impl_data._M_start);
  }
  else {
    ::std::operator<<(local_1a0,
                      (vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_> *)&local_1e8);
  }
  ::std::operator<<(local_1a0,"\n");
  ::std::__cxx11::stringbuf::str();
  ::std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>::~vector
            ((vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_> *)&local_1e8);
  ::std::__cxx11::stringstream::~stringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

std::string print_payload(const prim::PayloadList &payload,
                          const uint32_t indent) {
  std::stringstream ss;

  auto listEditQual = std::get<0>(payload);
  auto vars = std::get<1>(payload);

  ss << pprint::Indent(indent);

  if (listEditQual != ListEditQual::ResetToExplicit) {
    ss << to_string(listEditQual) << " ";
  }

  ss << "payload = ";
  if (vars.empty()) {
    ss << "None";
  } else {
    if (vars.size() == 1) {
      ss << vars[0];
    } else {
      ss << vars;
    }
  }
  ss << "\n";

  return ss.str();
}